

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O1

Vector * turbulence_3d(Vector *__return_storage_ptr__,Vector *p,int octaves)

{
  double dVar1;
  Vector r;
  Vector local_80;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  Vector local_38;
  
  local_80.x = p->x;
  local_80.y = p->y;
  local_80.z = p->z;
  Turbulence3dCalls = Turbulence3dCalls + 1;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  dVar1 = __return_storage_ptr__->z;
  if (octaves < 1) {
    local_50 = 0.0;
    local_40 = 0.0;
  }
  else {
    local_40 = 0.0;
    local_68 = 1.0;
    local_50 = 0.0;
    do {
      local_60 = local_80.y;
      local_58 = local_80.x;
      local_48 = local_80.z;
      noise_3d(&local_38,&local_80);
      local_40 = local_40 + local_38.x * local_68;
      local_50 = local_50 + local_38.y * local_68;
      dVar1 = dVar1 + local_38.z * local_68;
      local_80.x = local_58 + local_58;
      local_80.y = local_60 + local_60;
      local_80.z = local_48 + local_48;
      local_68 = local_68 * 0.5;
      octaves = octaves + -1;
    } while (octaves != 0);
  }
  __return_storage_ptr__->x = local_40;
  __return_storage_ptr__->y = local_50;
  __return_storage_ptr__->z = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Vector turbulence_3d( const Vector&  p, int octaves )
{
   double k = 1;
   Vector r = p;
   Vector res(0);
   int   i;

   Turbulence3dCalls++;

   for( i = 0; i <   octaves; i++ )
   {
      res   += noise_3d(r) * k;
      r *= 2;
      k *= 0.5;
   }
   return res;
}